

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_names.cc
# Opt level: O0

bool prometheus::anon_unknown_3::nameStartsValid(string *name)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  bool reserved_for_internal_purposes;
  string *name_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::front();
    bVar1 = isLocaleIndependentDigit(*pcVar4);
    if (bVar1) {
      name_local._7_1_ = false;
    }
    else {
      iVar2 = std::__cxx11::string::compare((ulong)name,0,(char *)0x2);
      if (iVar2 == 0) {
        name_local._7_1_ = false;
      }
      else {
        name_local._7_1_ = true;
      }
    }
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool nameStartsValid(const std::string& name) {
  // must not be empty
  if (name.empty()) {
    return false;
  }

  // must not start with a digit
  if (isLocaleIndependentDigit(name.front())) {
    return false;
  }

  // must not start with "__"
  auto reserved_for_internal_purposes = name.compare(0, 2, "__") == 0;
  if (reserved_for_internal_purposes) return false;

  return true;
}